

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

void __thiscall
MyClient::OnAdvertisement
          (MyClient *this,string *ipString,uint16_t port,uint8_t *data,uint32_t bytes)

{
  char *in_RCX;
  string *in_RSI;
  int in_R8D;
  uint8_t pong [5];
  LogStringBuffer buffer_1;
  LogStringBuffer buffer;
  LogStringBuffer buffer_2;
  char *in_stack_ffffffffffffef08;
  LogStringBuffer *in_stack_ffffffffffffef10;
  undefined8 in_stack_ffffffffffffef18;
  uint16_t port_00;
  string *in_stack_ffffffffffffef20;
  SDKSocket *in_stack_ffffffffffffef28;
  LogStringBuffer *in_stack_ffffffffffffef48;
  Channel *pCVar1;
  LogStringBuffer *buffer_00;
  OutputWorker *in_stack_ffffffffffffef50;
  Channel *this_00;
  uint local_fec [4];
  ushort local_fda [9];
  char *local_fc8;
  uint *local_fc0;
  char *local_fb8;
  ushort *local_fb0;
  char *local_fa8;
  char *local_f98;
  Channel *local_f90;
  char *local_f88;
  uint *local_f80;
  char *local_f78;
  ushort *local_f70;
  char *local_f68;
  char *local_f58;
  Channel *local_f50;
  char *local_f48;
  uint *local_f40;
  char *local_f38;
  ushort *local_f30;
  char *local_f28;
  char *local_f18;
  Channel *local_f10;
  char *local_f08;
  uint *local_f00;
  char *local_ef8;
  ushort *local_ef0;
  char *local_ee8;
  char *local_ed8;
  undefined4 local_ecc;
  Channel *local_ec8;
  undefined4 local_ebc;
  Channel *local_eb8;
  char *local_eb0;
  uint *local_ea8;
  char *local_ea0;
  ushort *local_e98;
  char *local_e90;
  char *local_e80;
  undefined4 local_e74;
  Channel *local_e70;
  undefined4 local_e64;
  Channel *local_e60;
  undefined1 local_e48 [16];
  ostream aoStack_e38 [376];
  char *local_cc0;
  uint *local_cb8;
  char *local_cb0;
  ushort *local_ca8;
  char *local_ca0;
  string *local_c98;
  char *local_c90;
  undefined4 local_c84;
  Channel *local_c80;
  undefined1 local_c68 [16];
  ostream aoStack_c58 [376];
  char *local_ae0;
  uint *local_ad8;
  char *local_ad0;
  ushort *local_ac8;
  char *local_ac0;
  string *local_ab8;
  char *local_ab0;
  undefined4 local_aa4;
  Channel *local_aa0;
  char *local_a98;
  uint *local_a90;
  char *local_a88;
  ushort *local_a80;
  char *local_a78;
  string *local_a70;
  char *local_a68;
  undefined8 local_a60;
  undefined1 *local_a58;
  Channel *local_a50;
  undefined8 local_a48;
  undefined1 *local_a40;
  Channel *local_a38;
  undefined8 local_a30;
  undefined1 *local_a28;
  char *local_a20;
  uint *local_a18;
  char *local_a10;
  ushort *local_a08;
  char *local_a00;
  string *local_9f8;
  char *local_9f0;
  undefined8 local_9e8;
  undefined1 *local_9e0;
  Channel *local_9d8;
  undefined8 local_9d0;
  undefined1 *local_9c8;
  Channel *local_9c0;
  undefined8 local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  uint *local_9a0;
  char *local_998;
  ushort *local_990;
  char *local_988;
  string *local_980;
  char *local_978;
  undefined1 *local_970;
  Channel *local_968;
  char *local_960;
  uint *local_958;
  char *local_950;
  ushort *local_948;
  char *local_940;
  string *local_938;
  char *local_930;
  undefined1 *local_928;
  Channel *local_920;
  char *local_918;
  undefined1 *local_910;
  Channel *local_908;
  char *local_900;
  undefined1 *local_8f8;
  Channel *local_8f0;
  char *local_8e8;
  uint *local_8e0;
  char *local_8d8;
  ushort *local_8d0;
  char *local_8c8;
  string *local_8c0;
  undefined1 *local_8b8;
  Channel *local_8b0;
  string *local_8a8;
  undefined1 *local_8a0;
  Channel *local_898;
  string *local_890;
  undefined1 *local_888;
  char *local_880;
  uint *local_878;
  char *local_870;
  ushort *local_868;
  char *local_860;
  string *local_858;
  undefined1 *local_850;
  Channel *local_848;
  string *local_840;
  undefined1 *local_838;
  Channel *local_830;
  string *local_828;
  undefined1 *local_820;
  char *local_818;
  undefined1 *local_810;
  char *local_808;
  undefined1 *local_800;
  char *local_7f8;
  uint *local_7f0;
  char *local_7e8;
  ushort *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  Channel *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  Channel *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  uint *local_790;
  char *local_788;
  ushort *local_780;
  char *local_778;
  undefined1 *local_770;
  Channel *local_768;
  char *local_760;
  undefined1 *local_758;
  Channel *local_750;
  char *local_748;
  undefined1 *local_740;
  char *local_738;
  uint *local_730;
  char *local_728;
  ushort *local_720;
  undefined1 *local_718;
  Channel *local_710;
  char *local_708;
  uint *local_700;
  char *local_6f8;
  ushort *local_6f0;
  undefined1 *local_6e8;
  Channel *local_6e0;
  ushort *local_6d8;
  undefined1 *local_6d0;
  Channel *local_6c8;
  ushort *local_6c0;
  undefined1 *local_6b8;
  Channel *local_6b0;
  char *local_6a8;
  uint *local_6a0;
  char *local_698;
  undefined1 *local_690;
  Channel *local_688;
  char *local_680;
  undefined1 *local_678;
  Channel *local_670;
  char *local_668;
  undefined1 *local_660;
  char *local_658;
  uint *local_650;
  char *local_648;
  undefined1 *local_640;
  Channel *local_638;
  char *local_630;
  undefined1 *local_628;
  Channel *local_620;
  char *local_618;
  undefined1 *local_610;
  ushort *local_608;
  undefined1 *local_600;
  ushort *local_5f8;
  undefined1 *local_5f0;
  char *local_5e8;
  uint *local_5e0;
  undefined1 *local_5d8;
  Channel *local_5d0;
  uint *local_5c8;
  undefined1 *local_5c0;
  Channel *local_5b8;
  uint *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  uint *local_598;
  undefined1 *local_590;
  Channel *local_588;
  uint *local_580;
  undefined1 *local_578;
  Channel *local_570;
  uint *local_568;
  undefined1 *local_560;
  char *local_558;
  undefined1 *local_550;
  Channel *local_548;
  char *local_540;
  undefined1 *local_538;
  Channel *local_530;
  char *local_528;
  undefined1 *local_520;
  char *local_518;
  undefined1 *local_510;
  char *local_508;
  uint *local_500;
  char *local_4f8;
  ushort *local_4f0;
  char *local_4e8;
  char *local_4d8;
  undefined4 local_4cc;
  Channel *local_4c8;
  undefined4 local_4bc;
  Channel *local_4b8;
  undefined1 local_4a0 [16];
  ostream aoStack_490 [376];
  char *local_318;
  uint *local_310;
  char *local_308;
  ushort *local_300;
  char *local_2f8;
  string *local_2f0;
  char *local_2e8;
  undefined4 local_2dc;
  Channel *local_2d8;
  char *local_2d0;
  uint *local_2c8;
  char *local_2c0;
  ushort *local_2b8;
  char *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined8 local_298;
  undefined1 *local_290;
  Channel *local_288;
  undefined8 local_280;
  undefined1 *local_278;
  Channel *local_270;
  undefined8 local_268;
  undefined1 *local_260;
  char *local_258;
  uint *local_250;
  char *local_248;
  ushort *local_240;
  char *local_238;
  string *local_230;
  char *local_228;
  undefined1 *local_220;
  LogStringBuffer *local_218;
  char *local_210;
  uint *local_208;
  char *local_200;
  ushort *local_1f8;
  char *local_1f0;
  string *local_1e8;
  undefined1 *local_1e0;
  LogStringBuffer *local_1d8;
  string *local_1d0;
  undefined1 *local_1c8;
  LogStringBuffer *local_1c0;
  string *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  uint *local_1a0;
  char *local_198;
  ushort *local_190;
  char *local_188;
  undefined1 *local_180;
  LogStringBuffer *local_178;
  char *local_170;
  undefined1 *local_168;
  LogStringBuffer *local_160;
  char *local_158;
  undefined1 *local_150;
  char *local_148;
  uint *local_140;
  char *local_138;
  ushort *local_130;
  undefined1 *local_128;
  LogStringBuffer *local_120;
  ushort *local_118;
  undefined1 *local_110;
  LogStringBuffer *local_108;
  char *local_100;
  uint *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  LogStringBuffer *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  LogStringBuffer *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  ushort *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  uint *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  uint *local_80;
  undefined1 *local_78;
  LogStringBuffer *local_70;
  uint *local_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 *local_50;
  LogStringBuffer *local_48;
  char *local_40;
  undefined1 *local_38;
  char *local_30;
  undefined1 *local_28;
  LogStringBuffer *local_20;
  char *local_18;
  undefined1 *local_10;
  
  port_00 = (uint16_t)((ulong)in_stack_ffffffffffffef18 >> 0x30);
  if (in_R8D == 5) {
    if (*in_RCX == 'd') {
      local_f50 = &Logger;
      local_f58 = "Advertisement PING received from ";
      local_f68 = ":";
      local_f70 = local_fda;
      local_f78 = " - ";
      local_f80 = local_fec;
      local_f88 = " bytes";
      local_ec8 = &Logger;
      local_ecc = 2;
      local_ed8 = "Advertisement PING received from ";
      local_ee8 = ":";
      local_ef8 = " - ";
      local_f08 = " bytes";
      local_eb8 = &Logger;
      local_ebc = 2;
      local_f00 = local_f80;
      local_ef0 = local_f70;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_aa0 = &Logger;
        local_aa4 = 2;
        local_ab0 = "Advertisement PING received from ";
        local_ac0 = ":";
        local_ad0 = " - ";
        local_ae0 = " bytes";
        local_ad8 = local_f80;
        local_ac8 = local_f70;
        local_ab8 = in_RSI;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,Trace);
        local_a60 = 0x12d358;
        local_a50 = &Logger;
        local_a68 = local_ab0;
        local_a70 = local_ab8;
        local_a78 = local_ac0;
        local_a80 = local_ac8;
        local_a88 = local_ad0;
        local_a90 = local_ad8;
        local_a98 = local_ae0;
        local_a38 = &Logger;
        local_a58 = local_c68;
        local_a48 = local_a60;
        local_a40 = local_c68;
        local_a30 = local_a60;
        local_a28 = local_c68;
        std::operator<<(aoStack_c58,(string *)&Logger.Prefix);
        local_920 = &Logger;
        local_928 = local_a58;
        local_930 = local_a68;
        local_938 = local_a70;
        local_940 = local_a78;
        local_948 = local_a80;
        local_950 = local_a88;
        local_958 = local_a90;
        local_960 = local_a98;
        local_908 = &Logger;
        local_910 = local_a58;
        local_918 = local_a68;
        local_800 = local_a58;
        local_808 = local_a68;
        std::operator<<((ostream *)(local_a58 + 0x10),local_a68);
        local_8b0 = &Logger;
        local_8b8 = local_928;
        local_8c0 = local_938;
        local_8c8 = local_940;
        local_8d0 = local_948;
        local_8d8 = local_950;
        local_8e0 = local_958;
        local_8e8 = local_960;
        local_898 = &Logger;
        local_8a0 = local_928;
        local_8a8 = local_938;
        local_888 = local_928;
        local_890 = local_938;
        std::operator<<((ostream *)(local_928 + 0x10),local_938);
        local_768 = &Logger;
        local_770 = local_8b8;
        local_778 = local_8c8;
        local_780 = local_8d0;
        local_788 = local_8d8;
        local_790 = local_8e0;
        local_798 = local_8e8;
        local_750 = &Logger;
        local_758 = local_8b8;
        local_760 = local_8c8;
        local_740 = local_8b8;
        local_748 = local_8c8;
        std::operator<<((ostream *)(local_8b8 + 0x10),local_8c8);
        local_710 = &Logger;
        local_718 = local_770;
        local_720 = local_780;
        local_728 = local_788;
        local_730 = local_790;
        local_738 = local_798;
        local_6b0 = &Logger;
        local_6b8 = local_770;
        local_6c0 = local_780;
        local_600 = local_770;
        local_608 = local_780;
        std::ostream::operator<<((ostream *)(local_770 + 0x10),*local_780);
        local_638 = &Logger;
        local_640 = local_718;
        local_648 = local_728;
        local_650 = local_730;
        local_658 = local_738;
        local_620 = &Logger;
        local_628 = local_718;
        local_630 = local_728;
        local_610 = local_718;
        local_618 = local_728;
        std::operator<<((ostream *)(local_718 + 0x10),local_728);
        local_5d0 = &Logger;
        local_5d8 = local_640;
        local_5e0 = local_650;
        local_5e8 = local_658;
        local_5b8 = &Logger;
        local_5c0 = local_640;
        local_5c8 = local_650;
        local_5a8 = local_640;
        local_5b0 = local_650;
        std::ostream::operator<<((ostream *)(local_640 + 0x10),*local_650);
        local_530 = &Logger;
        local_538 = local_5d8;
        local_540 = local_5e8;
        local_520 = local_5d8;
        local_528 = local_5e8;
        std::operator<<((ostream *)(local_5d8 + 0x10),local_5e8);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10c72f);
      }
      tonk::SDKSocket::Advertise
                (in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,port_00,
                 in_stack_ffffffffffffef10,(uint32_t)((ulong)in_stack_ffffffffffffef08 >> 0x20));
      return;
    }
    if (*in_RCX == 'e') {
      local_f90 = &Logger;
      local_f98 = "Advertisement PONG received from ";
      local_fa8 = ":";
      local_fb0 = local_fda;
      local_fb8 = " - ";
      local_fc0 = local_fec;
      local_fc8 = " bytes";
      local_e70 = &Logger;
      local_e74 = 2;
      local_e80 = "Advertisement PONG received from ";
      local_e90 = ":";
      local_ea0 = " - ";
      local_eb0 = " bytes";
      local_e60 = &Logger;
      local_e64 = 2;
      if (2 < (int)Logger.ChannelMinLevel) {
        return;
      }
      local_c80 = &Logger;
      local_c84 = 2;
      local_c90 = "Advertisement PONG received from ";
      local_ca0 = ":";
      local_cb0 = " - ";
      local_cc0 = " bytes";
      local_ea8 = local_fc0;
      local_e98 = local_fb0;
      local_cb8 = local_fc0;
      local_ca8 = local_fb0;
      local_c98 = in_RSI;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,Trace);
      local_9e8 = 0x12d358;
      local_9d8 = &Logger;
      local_9f0 = local_c90;
      local_9f8 = local_c98;
      local_a00 = local_ca0;
      local_a08 = local_ca8;
      local_a10 = local_cb0;
      local_a18 = local_cb8;
      local_a20 = local_cc0;
      local_9c0 = &Logger;
      local_9e0 = local_e48;
      local_9d0 = local_9e8;
      local_9c8 = local_e48;
      local_9b8 = local_9e8;
      local_9b0 = local_e48;
      std::operator<<(aoStack_e38,(string *)&Logger.Prefix);
      local_968 = &Logger;
      local_970 = local_9e0;
      local_978 = local_9f0;
      local_980 = local_9f8;
      local_988 = local_a00;
      local_990 = local_a08;
      local_998 = local_a10;
      local_9a0 = local_a18;
      local_9a8 = local_a20;
      local_8f0 = &Logger;
      local_8f8 = local_9e0;
      local_900 = local_9f0;
      local_810 = local_9e0;
      local_818 = local_9f0;
      std::operator<<((ostream *)(local_9e0 + 0x10),local_9f0);
      local_848 = &Logger;
      local_850 = local_970;
      local_858 = local_980;
      local_860 = local_988;
      local_868 = local_990;
      local_870 = local_998;
      local_878 = local_9a0;
      local_880 = local_9a8;
      local_830 = &Logger;
      local_838 = local_970;
      local_840 = local_980;
      local_820 = local_970;
      local_828 = local_980;
      std::operator<<((ostream *)(local_970 + 0x10),local_980);
      local_7c8 = &Logger;
      local_7d0 = local_850;
      local_7d8 = local_860;
      local_7e0 = local_868;
      local_7e8 = local_870;
      local_7f0 = local_878;
      local_7f8 = local_880;
      local_7b0 = &Logger;
      local_7b8 = local_850;
      local_7c0 = local_860;
      local_7a0 = local_850;
      local_7a8 = local_860;
      std::operator<<((ostream *)(local_850 + 0x10),local_860);
      local_6e0 = &Logger;
      local_6e8 = local_7d0;
      local_6f0 = local_7e0;
      local_6f8 = local_7e8;
      local_700 = local_7f0;
      local_708 = local_7f8;
      local_6c8 = &Logger;
      local_6d0 = local_7d0;
      local_6d8 = local_7e0;
      local_5f0 = local_7d0;
      local_5f8 = local_7e0;
      std::ostream::operator<<((ostream *)(local_7d0 + 0x10),*local_7e0);
      local_688 = &Logger;
      local_690 = local_6e8;
      local_698 = local_6f8;
      local_6a0 = local_700;
      local_6a8 = local_708;
      local_670 = &Logger;
      local_678 = local_6e8;
      local_680 = local_6f8;
      local_660 = local_6e8;
      local_668 = local_6f8;
      std::operator<<((ostream *)(local_6e8 + 0x10),local_6f8);
      local_588 = &Logger;
      local_590 = local_690;
      local_598 = local_6a0;
      local_5a0 = local_6a8;
      local_570 = &Logger;
      local_578 = local_690;
      local_580 = local_6a0;
      local_560 = local_690;
      local_568 = local_6a0;
      std::ostream::operator<<((ostream *)(local_690 + 0x10),*local_6a0);
      local_548 = &Logger;
      local_550 = local_590;
      local_558 = local_5a0;
      local_510 = local_590;
      local_518 = local_5a0;
      std::operator<<((ostream *)(local_590 + 0x10),local_5a0);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10d08d);
      return;
    }
  }
  local_f10 = &Logger;
  local_f18 = "Unknown advertisement received from ";
  local_f28 = ":";
  local_f30 = local_fda;
  local_f38 = " - ";
  local_f40 = local_fec;
  local_f48 = " bytes";
  local_4c8 = &Logger;
  local_4cc = 4;
  local_4d8 = "Unknown advertisement received from ";
  local_4e8 = ":";
  local_4f8 = " - ";
  local_508 = " bytes";
  this_00 = &Logger;
  local_4b8 = &Logger;
  local_4bc = 4;
  if ((int)Logger.ChannelMinLevel < 5) {
    local_2d8 = &Logger;
    local_2dc = 4;
    local_2e8 = "Unknown advertisement received from ";
    local_2f8 = ":";
    local_308 = " - ";
    local_318 = " bytes";
    local_500 = local_f40;
    local_4f0 = local_f30;
    local_310 = local_f40;
    local_300 = local_f30;
    local_2f0 = in_RSI;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,Trace);
    local_298 = 0x12d358;
    local_288 = &Logger;
    local_2a0 = local_2e8;
    local_2a8 = local_2f0;
    local_2b0 = local_2f8;
    local_2b8 = local_300;
    local_2c0 = local_308;
    local_2c8 = local_310;
    local_2d0 = local_318;
    pCVar1 = &Logger;
    local_270 = &Logger;
    local_290 = local_4a0;
    local_280 = local_298;
    local_278 = local_4a0;
    local_268 = local_298;
    local_260 = local_4a0;
    std::operator<<(aoStack_490,(string *)&Logger.Prefix);
    local_220 = local_290;
    local_228 = local_2a0;
    local_230 = local_2a8;
    local_238 = local_2b0;
    local_240 = local_2b8;
    local_248 = local_2c0;
    local_250 = local_2c8;
    local_258 = local_2d0;
    local_28 = local_290;
    local_30 = local_2a0;
    local_10 = local_290;
    local_18 = local_2a0;
    buffer_00 = (LogStringBuffer *)pCVar1;
    local_218 = (LogStringBuffer *)pCVar1;
    local_20 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_290 + 0x10),local_2a0);
    local_1e0 = local_220;
    local_1e8 = local_230;
    local_1f0 = local_238;
    local_1f8 = local_240;
    local_200 = local_248;
    local_208 = local_250;
    local_210 = local_258;
    local_1c8 = local_220;
    local_1d0 = local_230;
    local_1b0 = local_220;
    local_1b8 = local_230;
    local_1d8 = (LogStringBuffer *)pCVar1;
    local_1c0 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_220 + 0x10),local_230);
    local_180 = local_1e0;
    local_188 = local_1f0;
    local_190 = local_1f8;
    local_198 = local_200;
    local_1a0 = local_208;
    local_1a8 = local_210;
    local_168 = local_1e0;
    local_170 = local_1f0;
    local_150 = local_1e0;
    local_158 = local_1f0;
    local_178 = (LogStringBuffer *)pCVar1;
    local_160 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_1e0 + 0x10),local_1f0);
    local_128 = local_180;
    local_130 = local_190;
    local_138 = local_198;
    local_140 = local_1a0;
    local_148 = local_1a8;
    local_110 = local_180;
    local_118 = local_190;
    local_a8 = local_180;
    local_b0 = local_190;
    local_120 = (LogStringBuffer *)pCVar1;
    local_108 = (LogStringBuffer *)pCVar1;
    std::ostream::operator<<((ostream *)(local_180 + 0x10),*local_190);
    local_e8 = local_128;
    local_f0 = local_138;
    local_f8 = local_140;
    local_100 = local_148;
    local_d0 = local_128;
    local_d8 = local_138;
    local_b8 = local_128;
    local_c0 = local_138;
    local_e0 = (LogStringBuffer *)pCVar1;
    local_c8 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_128 + 0x10),local_138);
    local_90 = local_e8;
    local_98 = local_f8;
    local_a0 = local_100;
    local_78 = local_e8;
    local_80 = local_f8;
    local_60 = local_e8;
    local_68 = local_f8;
    local_88 = (LogStringBuffer *)pCVar1;
    local_70 = (LogStringBuffer *)pCVar1;
    std::ostream::operator<<((ostream *)(local_e8 + 0x10),*local_f8);
    local_50 = local_90;
    local_58 = local_a0;
    local_38 = local_90;
    local_40 = local_a0;
    local_48 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_90 + 0x10),local_a0);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write((OutputWorker *)this_00,buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10d95b);
  }
  return;
}

Assistant:

void MyClient::OnAdvertisement(
    const std::string& ipString, ///< Source IP address of advertisement
    uint16_t               port, ///< Source port address of advertisement
    const uint8_t*         data,  ///< Pointer to a buffer containing the message data
    uint32_t              bytes)  ///< Number of bytes in the message
{
    if (bytes == test::kPongBytes)
    {
        if (data[0] == test::ID_Advertise_Ping)
        {
            Logger.Info("Advertisement PING received from ", ipString, ":", port, " - ", bytes, " bytes");

            uint8_t pong[test::kPongBytes] = {
                test::ID_Advertise_Pong, 1, 2, 3, 4
            };
            Advertise(ipString, port, pong, test::kPongBytes);
            return;
        }

        if (data[0] == test::ID_Advertise_Pong)
        {
            Logger.Info("Advertisement PONG received from ", ipString, ":", port, " - ", bytes, " bytes");
            return;
        }
    }

    Logger.Error("Unknown advertisement received from ", ipString, ":", port, " - ", bytes, " bytes");
}